

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_stages<VkRayTracingPipelineCreateInfoKHR>
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info,ScratchAllocator *alloc,
          VkDevice device,PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          DynamicStateInfo *dynamic_state_info)

{
  uint uVar1;
  VkSpecializationInfo *info_00;
  Impl *this_00;
  bool bVar2;
  VkPipelineShaderStageCreateInfo *pVVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  void *pNext;
  VkRayTracingPipelineCreateInfoKHR *local_58;
  VkDevice local_50;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT local_48;
  Impl *local_40;
  DynamicStateInfo *local_38;
  
  local_50 = device;
  local_48 = gsmcii;
  local_40 = this;
  local_38 = dynamic_state_info;
  pVVar3 = copy<VkPipelineShaderStageCreateInfo>(this,info->pStages,(ulong)info->stageCount,alloc);
  info->pStages = pVVar3;
  uVar7 = 0xffffffffffffffff;
  lVar6 = 0x28;
  local_58 = info;
  do {
    uVar1 = local_58->stageCount;
    uVar7 = uVar7 + 1;
    if (uVar1 <= uVar7) break;
    pVVar3 = local_58->pStages;
    pcVar5 = *(char **)((long)pVVar3 + lVar6 + -8);
    if (pcVar5 == (char *)0x0) break;
    sVar4 = strlen(pcVar5);
    this_00 = local_40;
    pcVar5 = copy<char>(local_40,pcVar5,sVar4 + 1,alloc);
    *(char **)((long)pVVar3 + lVar6 + -8) = pcVar5;
    info_00 = *(VkSpecializationInfo **)((long)&pVVar3->sType + lVar6);
    if (info_00 != (VkSpecializationInfo *)0x0) {
      copy_specialization_info
                (this_00,info_00,alloc,(VkSpecializationInfo **)((long)&pVVar3->sType + lVar6));
    }
    pNext = (void *)0x0;
    bVar2 = copy_pnext_chain(this_00,*(void **)((long)pVVar3 + lVar6 + -0x20),alloc,&pNext,local_38,
                             0);
    if (!bVar2) break;
    *(void **)((long)pVVar3 + lVar6 + -0x20) = pNext;
    bVar2 = add_module_identifier
                      ((VkPipelineShaderStageCreateInfo *)((long)pVVar3 + lVar6 + -0x28),alloc,
                       local_50,local_48);
    lVar6 = lVar6 + 0x30;
  } while (bVar2);
  return uVar1 <= uVar7;
}

Assistant:

bool StateRecorder::Impl::copy_stages(CreateInfo *info, ScratchAllocator &alloc,
                                      VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                      const DynamicStateInfo *dynamic_state_info)
{
	info->pStages = copy(info->pStages, info->stageCount, alloc);
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);

		if (!stage.pName)
			return false;

		stage.pName = copy(stage.pName, strlen(stage.pName) + 1, alloc);
		if (stage.pSpecializationInfo)
			if (!copy_specialization_info(stage.pSpecializationInfo, alloc, &stage.pSpecializationInfo))
				return false;

		const void *pNext = nullptr;
		if (!copy_pnext_chain(stage.pNext, alloc, &pNext, dynamic_state_info, 0))
			return false;

		stage.pNext = pNext;

		if (!add_module_identifier(&stage, alloc, device, gsmcii))
			return false;
	}

	return true;
}